

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

Map_Cut_t * Map_CutArray2List(Map_Cut_t **pArray,int nCuts)

{
  int local_2c;
  Map_Cut_t *pMStack_28;
  int i;
  Map_Cut_t **ppListNew;
  Map_Cut_t *pListNew;
  Map_Cut_t *pMStack_10;
  int nCuts_local;
  Map_Cut_t **pArray_local;
  
  ppListNew = (Map_Cut_t **)0x0;
  pMStack_28 = (Map_Cut_t *)&ppListNew;
  pListNew._4_4_ = nCuts;
  pMStack_10 = (Map_Cut_t *)pArray;
  for (local_2c = 0; local_2c < pListNew._4_4_; local_2c = local_2c + 1) {
    pMStack_28->pNext =
         *(Map_Cut_t **)((long)pMStack_10->ppLeaves + (long)local_2c * 8 + 0xffffffffffffffe8U);
    pMStack_28 = *(Map_Cut_t **)
                  ((long)pMStack_10->ppLeaves + (long)local_2c * 8 + 0xffffffffffffffe8U);
  }
  pMStack_28->pNext = (Map_Cut_t *)0x0;
  return (Map_Cut_t *)ppListNew;
}

Assistant:

Map_Cut_t * Map_CutArray2List( Map_Cut_t ** pArray, int nCuts )
{
    Map_Cut_t * pListNew, ** ppListNew;
    int i;
    pListNew  = NULL;
    ppListNew = &pListNew;
    for ( i = 0; i < nCuts; i++ )
    {
        // connect these lists
        *ppListNew = pArray[i];
        ppListNew  = &pArray[i]->pNext;
    }
//printf( "\n" );

    *ppListNew = NULL;
    return pListNew;
}